

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O0

_Bool blob_overwrite_bytes(blob *blob,size_t offset,void *bytes,size_t to_write)

{
  size_t to_write_local;
  void *bytes_local;
  size_t offset_local;
  blob *blob_local;
  
  if ((offset + to_write < offset) || (blob->size < offset + to_write)) {
    blob_local._7_1_ = false;
  }
  else {
    if (blob->data != (uint8_t *)0x0) {
      memcpy(blob->data + offset,bytes,to_write);
    }
    blob_local._7_1_ = true;
  }
  return blob_local._7_1_;
}

Assistant:

bool
blob_overwrite_bytes(struct blob *blob,
                     size_t offset,
                     const void *bytes,
                     size_t to_write)
{
   /* Detect an attempt to overwrite data out of bounds. */
   if (offset + to_write < offset || blob->size < offset + to_write)
      return false;

   VG(VALGRIND_CHECK_MEM_IS_DEFINED(bytes, to_write));

   if (blob->data)
      memcpy(blob->data + offset, bytes, to_write);

   return true;
}